

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.cpp
# Opt level: O3

void HandleTargetOutcome(bool success)

{
  void **in_RCX;
  void **args_base;
  int32_t in_ESI;
  undefined7 in_register_00000039;
  int64_t device_id;
  int64_t *in_R8;
  int64_t *in_R9;
  int unaff_retaddr;
  int in_stack_00000010;
  
  device_id = CONCAT71(in_register_00000039,success);
  if (TargetOffloadPolicy != tgt_disabled) {
    if (TargetOffloadPolicy != tgt_mandatory) {
      if (TargetOffloadPolicy != tgt_default) {
        return;
      }
      HandleTargetOutcome();
    }
    if ((char)device_id != '\0') {
      return;
    }
    HandleTargetOutcome();
  }
  if ((char)device_id == '\0') {
    return;
  }
  HandleTargetOutcome();
  if (in_stack_00000010 + unaff_retaddr != 0 &&
      SCARRY4(in_stack_00000010,unaff_retaddr) == in_stack_00000010 + unaff_retaddr < 0) {
    __kmpc_omp_taskwait(0,0);
  }
  __tgt_target_data_begin(device_id,in_ESI,args_base,in_RCX,in_R8,in_R9);
  return;
}

Assistant:

static void HandleTargetOutcome(bool success) {
  switch (TargetOffloadPolicy) {
    case tgt_disabled:
      if (success) {
        FATAL_MESSAGE0(1, "expected no offloading while offloading is disabled");
      }
      break;
    case tgt_default:
        FATAL_MESSAGE0(1, "default offloading policy must switched to " 
            "mandatory or disabled");
      break;
    case tgt_mandatory:
      if (!success) {
        FATAL_MESSAGE0(1, "failure of target construct while offloading is mandatory");
      }
      break;
  }
}